

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_scalar.c
# Opt level: O0

void gpointer_setglist(t_gpointer *gp,_glist *glist,t_scalar *x)

{
  _gstub *p_Var1;
  t_gstub *gs;
  t_scalar *x_local;
  _glist *glist_local;
  t_gpointer *gp_local;
  
  if (gp->gp_stub != (t_gstub *)0x0) {
    gstub_dis(gp->gp_stub);
  }
  p_Var1 = glist->gl_stub;
  gp->gp_stub = p_Var1;
  gp->gp_valid = glist->gl_valid;
  (gp->gp_un).gp_scalar = x;
  p_Var1->gs_refcount = p_Var1->gs_refcount + 1;
  return;
}

Assistant:

void gpointer_setglist(t_gpointer *gp, t_glist *glist, t_scalar *x)
{
    t_gstub *gs;
    if ((gs = gp->gp_stub)) gstub_dis(gs);
    gp->gp_stub = gs = glist->gl_stub;
    gp->gp_valid = glist->gl_valid;
    gp->gp_un.gp_scalar = x;
    gs->gs_refcount++;
}